

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::UnpackUnorm4x8Case::iterate(UnpackUnorm4x8Case *this)

{
  pointer *ppVVar1;
  ShaderExecutor *pSVar2;
  float fVar3;
  deUint32 dVar4;
  char *pcVar5;
  size_type sVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  reference pvVar10;
  float *pfVar11;
  int local_714;
  MessageBuilder local_710;
  MessageBuilder local_590;
  HexFloat local_410;
  HexFloat local_40c;
  HexFloat local_408;
  HexFloat local_404;
  HexFloat local_400;
  HexFloat local_3fc;
  HexFloat local_3f8;
  HexFloat local_3f4;
  Hex<8UL> local_3f0;
  MessageBuilder local_3e8;
  deUint32 local_264;
  uint local_260;
  deUint32 diff3;
  deUint32 diff2;
  deUint32 diff1;
  deUint32 diff0;
  float res3;
  float res2;
  float res1;
  float res0;
  float ref3;
  float ref2;
  float ref1;
  float ref0;
  deUint8 in3;
  deUint8 in2;
  deUint8 in1;
  deUint8 in0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  void *out;
  void *in;
  MessageBuilder local_208;
  deUint32 local_84;
  int local_80;
  value_type_conflict2 local_7c;
  int ndx;
  value_type_conflict2 local_74 [6];
  value_type_conflict2 local_5c;
  undefined1 local_58 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  Random rnd;
  deUint32 maxDiff;
  UnpackUnorm4x8Case *this_local;
  
  rnd.m_rnd.z = 1;
  unique0x1000120b = this;
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(pcVar5);
  de::Random::Random((Random *)
                     ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar4 ^ 0x776002
                    );
  ppVVar1 = &outputs.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58);
  local_5c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,&local_5c);
  local_74[1] = 0x7fff8000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_74 + 1);
  local_74[0] = 0x80007fff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_74);
  ndx = -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&ndx);
  local_7c = 0x1fffe;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7c);
  for (local_80 = 0; local_80 < 0x5f; local_80 = local_80 + 1) {
    local_84 = de::Random::getUint32
                         ((Random *)
                          ((long)&inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &outputs.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_84);
  }
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58,
             sVar6);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_208,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &outputs.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(unsigned_long *)&in);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_208);
  out = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &outputs.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  _maxPrints = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_58,0);
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pSVar2->_vptr_ShaderExecutor[6])(pSVar2,sVar6 & 0xffffffff,&out,&maxPrints);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar6;
  valNdx = 10;
  _in3 = 0;
  for (ref0 = 0.0; fVar3 = ref0,
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &outputs.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
      (int)fVar3 < (int)sVar6; ref0 = (float)((int)ref0 + 1)) {
    ppVVar1 = &outputs.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                        (long)(int)ref0);
    ref1._3_1_ = (byte)*pvVar9;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                        (long)(int)ref0);
    ref1._2_1_ = *(byte *)((long)pvVar9 + 1);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                        (long)(int)ref0);
    ref1._1_1_ = *(byte *)((long)pvVar9 + 2);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                        (long)(int)ref0);
    ref1._0_1_ = *(byte *)((long)pvVar9 + 3);
    ref2 = de::clamp<float>((float)ref1._3_1_ / 255.0,0.0,1.0);
    ref3 = de::clamp<float>((float)ref1._2_1_ / 255.0,0.0,1.0);
    res0 = de::clamp<float>((float)ref1._1_1_ / 255.0,0.0,1.0);
    res1 = de::clamp<float>((float)ref1._0_1_ / 255.0,0.0,1.0);
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_58,(long)(int)ref0);
    pfVar11 = tcu::Vector<float,_4>::x(pvVar10);
    res2 = *pfVar11;
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_58,(long)(int)ref0);
    pfVar11 = tcu::Vector<float,_4>::y(pvVar10);
    res3 = *pfVar11;
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_58,(long)(int)ref0);
    pfVar11 = tcu::Vector<float,_4>::z(pvVar10);
    diff0 = (deUint32)*pfVar11;
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_58,(long)(int)ref0);
    pfVar11 = tcu::Vector<float,_4>::w(pvVar10);
    diff1 = (deUint32)*pfVar11;
    diff2 = anon_unknown_2::getUlpDiff(ref2,res2);
    diff3 = anon_unknown_2::getUlpDiff(ref3,res3);
    local_260 = anon_unknown_2::getUlpDiff(res0,(float)diff0);
    local_264 = anon_unknown_2::getUlpDiff(res1,(float)diff1);
    if ((((1 < diff2) || (1 < diff3)) || (1 < local_260)) || (1 < local_264)) {
      if (_in3 < 10) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3e8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_3e8,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&ref0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])",\n");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [27])"  expected unpackUnorm4x8(")
        ;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &outputs.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref0);
        local_3f0 = tcu::toHex<unsigned_int>(*pvVar9);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [5])") = ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])0xf12e76);
        anon_unknown_2::HexFloat::HexFloat(&local_3f4,ref2);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f4);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        anon_unknown_2::HexFloat::HexFloat(&local_3f8,ref3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f8);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        anon_unknown_2::HexFloat::HexFloat(&local_3fc,res0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3fc);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        anon_unknown_2::HexFloat::HexFloat(&local_400,res1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_400);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0xf2e642);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])", got vec4(");
        anon_unknown_2::HexFloat::HexFloat(&local_404,res2);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_404);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        anon_unknown_2::HexFloat::HexFloat(&local_408,res3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_408);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        anon_unknown_2::HexFloat::HexFloat(&local_40c,(float)diff0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_40c);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        anon_unknown_2::HexFloat::HexFloat(&local_410,(float)diff1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_410);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0xf2e642);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [17])"\n  ULP diffs = (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&diff2);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&diff3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_260);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf95514);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_264);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"), max diff = ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&rnd.m_rnd.z);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3e8);
      }
      else if (_in3 == 10) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_590,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_590,(char (*) [4])0xf5a95f);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_590);
      }
      _in3 = _in3 + 1;
    }
  }
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_710,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  local_714 = numFailed - _in3;
  pMVar8 = tcu::MessageBuilder::operator<<(&local_710,&local_714);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0xf2448b);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&numFailed);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_710);
  pcVar5 = "Result comparison failed";
  if (_in3 == 0) {
    pcVar5 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(_in3 != 0),pcVar5);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint8	in0		= (deUint8)(inputs[valNdx] & 0xff);
				const deUint8	in1		= (deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deUint8	in2		= (deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deUint8	in3		= (deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 255.f, 0.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 255.f, 0.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 255.f, 0.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 255.f, 0.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}